

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * dbReallocFinish(sqlite3 *db,void *p,u64 n)

{
  void *pvVar1;
  size_t __n;
  
  if (db->mallocFailed == '\0') {
    if ((p < (db->lookaside).pStart) || ((db->lookaside).pTrueEnd <= p)) {
      pvVar1 = sqlite3Realloc(p,n);
      if (pvVar1 != (void *)0x0) {
        return pvVar1;
      }
      sqlite3OomFault(db);
    }
    else {
      pvVar1 = sqlite3DbMallocRawNN(db,n);
      if (pvVar1 != (void *)0x0) {
        __n = 0x80;
        if (p < (db->lookaside).pMiddle) {
          __n = (size_t)(db->lookaside).szTrue;
        }
        memcpy(pvVar1,p,__n);
        if (p == (void *)0x0) {
          return pvVar1;
        }
        sqlite3DbFreeNN(db,p);
        return pvVar1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

static SQLITE_NOINLINE void *dbReallocFinish(sqlite3 *db, void *p, u64 n){
  void *pNew = 0;
  assert( db!=0 );
  assert( p!=0 );
  if( db->mallocFailed==0 ){
    if( isLookaside(db, p) ){
      pNew = sqlite3DbMallocRawNN(db, n);
      if( pNew ){
        memcpy(pNew, p, lookasideMallocSize(db, p));
        sqlite3DbFree(db, p);
      }
    }else{
      assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      pNew = sqlite3Realloc(p, n);
      if( !pNew ){
        sqlite3OomFault(db);
      }
      sqlite3MemdebugSetType(pNew,
            (db->lookaside.bDisable==0 ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
    }
  }
  return pNew;
}